

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

int __thiscall CTcTokenizer::set_source(CTcTokenizer *this,char *src_filename,char *orig_name)

{
  CTcSrcFile *src_00;
  CTcTokFileDesc *desc_00;
  CTcTokStream *this_00;
  char *in_RDX;
  CTcTokenizer *in_RSI;
  long in_RDI;
  int default_charset_error;
  int charset_error;
  CTcSrcFile *src;
  CTcTokFileDesc *desc;
  int *in_stack_000001b8;
  int *in_stack_000001c0;
  char *in_stack_000001c8;
  CResLoader *in_stack_000001d0;
  char *in_stack_000001d8;
  CTcTokenizer *in_stack_ffffffffffffff90;
  CTcTokString *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint uVar1;
  size_t in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  size_t in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  clear_linebuf(in_stack_ffffffffffffff90);
  start_new_line((CTcTokenizer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff98,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  src_00 = CTcSrcFile::open_source
                     (in_stack_000001d8,in_stack_000001d0,in_stack_000001c8,in_stack_000001c0,
                      in_stack_000001b8);
  if (src_00 == (CTcSrcFile *)0x0) {
    if (in_stack_ffffffffffffffc8 != 0) {
      log_error(0x2748,*(undefined8 *)(in_RDI + 0x10));
    }
    local_4 = 0x2737;
  }
  else {
    strlen((char *)in_RSI);
    strlen(in_RDX);
    uVar1 = 0;
    desc_00 = get_file_desc(in_RSI,in_RDX,in_stack_ffffffffffffffd8,(int)((ulong)src_00 >> 0x20),
                            (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                            in_stack_ffffffffffffffc0);
    this_00 = (CTcTokStream *)operator_new(0x30);
    CTcTokStream::CTcTokStream
              (this_00,desc_00,&src_00->super_CTcSrcObject,(CTcTokStream *)(ulong)uVar1,
               in_stack_ffffffffffffffcc,*(int *)(in_RDI + 0x338));
    *(CTcTokStream **)(in_RDI + 0x58) = this_00;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CTcTokenizer::set_source(const char *src_filename, const char *orig_name)
{
    CTcTokFileDesc *desc;
    CTcSrcFile *src;
    int charset_error;
    int default_charset_error;
    
    /* empty out the input line buffer */
    clear_linebuf();

    /* set up at the beginning of the input line buffer */
    start_new_line(&linebuf_, 0);

    /* create a reader for the source file */
    src = CTcSrcFile::open_source(src_filename, res_loader_,
                                  default_charset_, &charset_error,
                                  &default_charset_error);
    if (src == 0)
    {
        /* if we had a problem loading the default character set, log it */
        if (default_charset_error)
            log_error(TCERR_CANT_LOAD_DEFAULT_CHARSET, default_charset_);
        
        /* return failure */
        return TCERR_CANT_OPEN_SRC;
    }

    /* find or create a file descriptor for this filename */
    desc = get_file_desc(src_filename, strlen(src_filename), FALSE,
                         orig_name, strlen(orig_name));

    /* 
     *   Create a stream to read the source file.  The new stream has no
     *   parent, because this is the top-level source file, and was not
     *   included from any other file.  
     */
    str_ = new CTcTokStream(desc, src, 0, charset_error, if_sp_);

    /* success */
    return 0;
}